

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O0

void __thiscall DebugStream::DebugStream(DebugStream *this,string *area)

{
  string *area_local;
  DebugStream *this_local;
  
  std::mutex::lock(&s_debugSection);
  std::operator<<((ostream *)&std::cout,(string *)area);
  return;
}

Assistant:

inline DebugStream(const std::string area)
    {
        s_debugSection.lock();
#if COLOR_DEBUG
        std::cout << "\033[1;34m" << area << "\033[1;37m>\033[1;32m";
#else
        std::cout << area;
#endif
    }